

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

value_type * __thiscall
wasm::Random::
pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
          (Random *this,
          vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          *vec)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint32_t index;
  vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
  *vec_local;
  Random *this_local;
  
  bVar1 = std::
          vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          ::empty(vec);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!vec.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                  ,0x50,
                  "const typename T::value_type &wasm::Random::pick(const T &) [T = std::vector<std::unique_ptr<wasm::Tag>>]"
                 );
  }
  sVar3 = std::
          vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
          ::size(vec);
  uVar2 = upTo(this,(uint32_t)sVar3);
  pvVar4 = std::
           vector<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ::operator[](vec,(ulong)uVar2);
  return pvVar4;
}

Assistant:

const typename T::value_type& pick(const T& vec) {
    assert(!vec.empty());
    auto index = upTo(vec.size());
    return vec[index];
  }